

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageRotate(Image *image,int degrees)

{
  undefined4 uVar1;
  undefined4 uVar3;
  void *pvVar2;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  int x;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_t __size;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint uVar26;
  float fVar27;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar28 [16];
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (0xd < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    fVar20 = ((float)degrees * 3.1415927) / 180.0;
    fVar21 = sinf(fVar20);
    fVar20 = cosf(fVar20);
    uVar1 = image->width;
    uVar3 = image->height;
    fVar30 = (float)(int)uVar1;
    fVar31 = (float)(int)uVar3;
    uVar22 = (uint)(ABS(fVar30 * fVar20) + ABS(fVar31 * fVar21));
    uVar26 = (uint)(ABS(fVar30 * fVar21) + ABS(fVar31 * fVar20));
    uVar5 = GetPixelDataSize(1,1,image->format);
    __size = (size_t)(int)uVar5;
    pvVar7 = calloc((long)(int)(uVar22 * uVar26),__size);
    uVar10 = 0;
    uVar16 = 0;
    if (0 < (int)uVar5) {
      uVar16 = (ulong)uVar5;
    }
    uVar17 = 0;
    if (0 < (int)uVar22) {
      uVar17 = (ulong)uVar22;
    }
    uVar4 = uVar26;
    if ((int)uVar26 < 1) {
      uVar4 = 0;
    }
    pvVar8 = pvVar7;
    pvVar15 = pvVar7;
    for (; uVar10 != uVar4; uVar10 = uVar10 + 1) {
      fVar32 = (float)(int)uVar10 - (float)(int)uVar26 * 0.5;
      pvVar14 = pvVar15;
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        fVar27 = (float)(int)uVar11 - (float)(int)uVar22 * 0.5;
        fVar23 = fVar27 * fVar20 + fVar32 * fVar21 + fVar30 * 0.5;
        fVar27 = (fVar32 * fVar20 - fVar27 * fVar21) + fVar31 * 0.5;
        if (0.0 <= fVar23) {
          iVar18 = -(uint)(fVar23 < fVar30);
          iVar19 = -(uint)(fVar27 < fVar31);
          auVar29._4_4_ = iVar19;
          auVar29._0_4_ = iVar18;
          auVar29._8_4_ = iVar19;
          auVar29._12_4_ = iVar19;
          auVar28._8_8_ = auVar29._8_8_;
          auVar28._4_4_ = iVar18;
          auVar28._0_4_ = iVar18;
          uVar6 = movmskpd((int)pvVar8,auVar28);
          pvVar8 = (void *)(ulong)uVar6;
          if ((byte)(0.0 <= fVar27 & (byte)uVar6 & (byte)uVar6 >> 1) == 1) {
            fVar24 = floorf(fVar23);
            iVar19 = (int)fVar24;
            fVar25 = floorf(fVar27);
            iVar18 = iVar19 + 1;
            if (uVar1 + -1 <= iVar19 + 1) {
              iVar18 = uVar1 + -1;
            }
            iVar12 = (int)fVar25 + 1;
            if (uVar3 + -1 <= iVar12) {
              iVar12 = uVar3 + -1;
            }
            fVar23 = fVar23 - (float)(int)fVar24;
            fVar27 = fVar27 - (float)(int)fVar25;
            iVar9 = (int)fVar25 * uVar1;
            pvVar8 = (void *)(long)(int)((iVar19 + iVar12 * uVar1) * uVar5);
            for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
              pvVar2 = image->data;
              *(char *)((long)pvVar14 + uVar13) =
                   (char)(int)((float)*(byte *)((long)pvVar2 +
                                               uVar13 + (long)(int)((iVar12 * uVar1 + iVar18) *
                                                                   uVar5)) * fVar23 * fVar27 +
                              (float)*(byte *)((long)pvVar8 + uVar13 + (long)pvVar2) *
                              (1.0 - fVar23) * fVar27 +
                              (float)*(byte *)((long)pvVar2 +
                                              uVar13 + (long)(int)((iVar9 + iVar18) * uVar5)) *
                              fVar23 * (1.0 - fVar27) +
                              (float)*(byte *)((long)pvVar2 +
                                              uVar13 + (long)(int)((iVar9 + iVar19) * uVar5)) *
                              (1.0 - fVar23) * (1.0 - fVar27));
            }
          }
        }
        pvVar14 = (void *)((long)pvVar14 + __size);
      }
      pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar22 * __size);
    }
    free(image->data);
    image->data = pvVar7;
    image->width = uVar22;
    image->height = uVar26;
  }
  return;
}

Assistant:

void ImageRotate(Image *image, int degrees)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        float rad = degrees*PI/180.0f;
        float sinRadius = sinf(rad);
        float cosRadius = cosf(rad);

        int width = (int)(fabsf(image->width*cosRadius) + fabsf(image->height*sinRadius));
        int height = (int)(fabsf(image->height*cosRadius) + fabsf(image->width*sinRadius));

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_CALLOC(width*height, bytesPerPixel);

        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                float oldX = ((x - width/2.0f)*cosRadius + (y - height/2.0f)*sinRadius) + image->width/2.0f;
                float oldY = ((y - height/2.0f)*cosRadius - (x - width/2.0f)*sinRadius) + image->height/2.0f;

                if ((oldX >= 0) && (oldX < image->width) && (oldY >= 0) && (oldY < image->height))
                {
                    int x1 = (int)floorf(oldX);
                    int y1 = (int)floorf(oldY);
                    int x2 = MIN(x1 + 1, image->width - 1);
                    int y2 = MIN(y1 + 1, image->height - 1);

                    float px = oldX - x1;
                    float py = oldY - y1;

                    for (int i = 0; i < bytesPerPixel; i++)
                    {
                        float f1 = ((unsigned char *)image->data)[(y1*image->width + x1)*bytesPerPixel + i];
                        float f2 = ((unsigned char *)image->data)[(y1*image->width + x2)*bytesPerPixel + i];
                        float f3 = ((unsigned char *)image->data)[(y2*image->width + x1)*bytesPerPixel + i];
                        float f4 = ((unsigned char *)image->data)[(y2*image->width + x2)*bytesPerPixel + i];

                        float val = f1*(1 - px)*(1 - py) + f2*px*(1 - py) + f3*(1 - px)*py + f4*px*py;

                        rotatedData[(y*width + x)*bytesPerPixel + i] = (unsigned char)val;
                    }
                }
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        image->width = width;
        image->height = height;
    }
}